

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O3

bool D_AddFile(TArray<FString,_FString> *wadfiles,char *file,bool check,int position)

{
  bool bVar1;
  char *copyStr;
  FString f;
  FString local_20;
  
  if ((file == (char *)0x0) || (*file == '\0')) {
    bVar1 = false;
  }
  else {
    copyStr = file;
    if (((!check) || (bVar1 = DirEntryExists(file), bVar1)) ||
       (copyStr = BaseFileSearch(file,".wad",false), copyStr != (char *)0x0)) {
      FString::FString(&local_20,copyStr);
      FString::ReplaceChars(&local_20,'\\','/');
      if (position == -1) {
        TArray<FString,_FString>::Grow(wadfiles,1);
        FString::AttachToOther(wadfiles->Array + wadfiles->Count,&local_20);
        wadfiles->Count = wadfiles->Count + 1;
      }
      else {
        TArray<FString,_FString>::Insert(wadfiles,position,&local_20);
      }
      FString::~FString(&local_20);
      bVar1 = true;
    }
    else {
      bVar1 = false;
      Printf("Can\'t find \'%s\'\n",file);
    }
  }
  return bVar1;
}

Assistant:

bool D_AddFile (TArray<FString> &wadfiles, const char *file, bool check, int position)
{
	if (file == NULL || *file == '\0')
	{
		return false;
	}

	if (check && !DirEntryExists (file))
	{
		const char *f = BaseFileSearch (file, ".wad");
		if (f == NULL)
		{
			Printf ("Can't find '%s'\n", file);
			return false;
		}
		file = f;
	}

	FString f = file;
	FixPathSeperator(f);
	if (position == -1) wadfiles.Push(f);
	else wadfiles.Insert(position, f);
	return true;
}